

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_non_empty_file(char *filename,wchar_t line,char *f1)

{
  int iVar1;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  stat st;
  stat local_b0;
  char *local_20;
  wchar_t local_14;
  char *local_10;
  wchar_t local_4;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  assertion_count(in_RDI,in_ESI);
  iVar1 = stat(local_20,&local_b0);
  if (iVar1 == 0) {
    if (local_b0.st_size == 0) {
      failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"File empty: %s",local_20);
      failure_finish((void *)0x10680a);
      local_4 = L'\0';
    }
    else {
      local_4 = L'\x01';
    }
  }
  else {
    failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"Stat failed: %s",local_20);
    failure_finish((void *)0x1067c7);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_non_empty_file(const char *filename, int line, const char *f1)
{
	struct stat st;

	assertion_count(filename, line);

	if (stat(f1, &st) != 0) {
		failure_start(filename, line, "Stat failed: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	if (st.st_size == 0) {
		failure_start(filename, line, "File empty: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}